

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  uint *__ptr;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uivector local_68;
  uivector local_48;
  
  local_48.data = (uint *)0x0;
  local_48.size = 0;
  local_48.allocsize = 0;
  local_68.data = (uint *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  puVar3 = (uint *)malloc((ulong)tree->numcodes << 2);
  tree->tree1d = puVar3;
  uVar6 = (ulong)(tree->maxbitlen + 1);
  uVar2 = uivector_resize(&local_48,uVar6);
  if (uVar2 != 0) {
    if (uVar6 != 0) {
      memset(local_48.data,0,uVar6 << 2);
    }
    uVar6 = (ulong)(tree->maxbitlen + 1);
    uVar2 = uivector_resize(&local_68,uVar6);
    if (uVar2 != 0) {
      if (uVar6 != 0) {
        memset(local_68.data,0,uVar6 << 2);
      }
      __ptr = local_68.data;
      if (puVar3 != (uint *)0x0) {
        if (tree->numcodes == 0) {
          uVar2 = 0;
        }
        else {
          uVar2 = 0;
          do {
            local_48.data[tree->lengths[uVar2]] = local_48.data[tree->lengths[uVar2]] + 1;
            uVar2 = uVar2 + 1;
          } while (uVar2 != tree->numcodes);
        }
        if (tree->maxbitlen != 0) {
          uVar2 = *local_68.data;
          uVar6 = 1;
          do {
            uVar2 = (uVar2 + local_48.data[(int)uVar6 - 1]) * 2;
            local_68.data[uVar6] = uVar2;
            uVar4 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar4;
          } while (uVar4 <= tree->maxbitlen);
          uVar2 = tree->numcodes;
        }
        if (uVar2 != 0) {
          uVar4 = 0;
          do {
            uVar6 = (ulong)tree->lengths[uVar4];
            if (uVar6 != 0) {
              uVar2 = local_68.data[uVar6];
              local_68.data[uVar6] = uVar2 + 1;
              tree->tree1d[uVar4] = uVar2;
              uVar2 = tree->numcodes;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 != uVar2);
        }
        local_48.size = 0;
        local_48.allocsize = 0;
        free(local_48.data);
        local_48.data = (uint *)0x0;
        local_68.size = 0;
        local_68.allocsize = 0;
        free(__ptr);
        local_68.data = (uint *)0x0;
        uVar2 = tree->numcodes;
        puVar3 = (uint *)malloc((ulong)(uVar2 * 2) << 2);
        tree->tree2d = puVar3;
        if (puVar3 == (uint *)0x0) {
          return 0x53;
        }
        if ((uVar2 & 0x7fffffff) != 0) {
          uVar6 = 0;
          do {
            tree->tree2d[uVar6] = 0x7fff;
            uVar6 = uVar6 + 1;
            uVar2 = tree->numcodes;
          } while (uVar6 < uVar2 * 2);
        }
        if (uVar2 != 0) {
          puVar3 = tree->lengths;
          uVar6 = 0;
          iVar7 = 0;
          iVar5 = 0;
          do {
            uVar4 = puVar3[uVar6];
            if (uVar4 != 0) {
              uVar2 = 0;
              do {
                if (iVar7 < 0) {
                  return 0x37;
                }
                uVar1 = tree->numcodes;
                if (uVar1 < iVar7 + 2U) {
                  return 0x37;
                }
                puVar3 = tree->tree2d;
                uVar8 = (uint)((tree->tree1d[uVar6] >> (~uVar2 + uVar4 & 0x1f) & 1) != 0) +
                        iVar7 * 2;
                if (puVar3[uVar8] == 0x7fff) {
                  uVar2 = uVar2 + 1;
                  if (uVar2 == uVar4) {
                    puVar3[uVar8] = (uint)uVar6;
                    iVar7 = 0;
                    uVar2 = uVar4;
                  }
                  else {
                    iVar7 = iVar5 + 1;
                    puVar3[uVar8] = iVar5 + uVar1 + 1;
                    iVar5 = iVar7;
                  }
                }
                else {
                  iVar7 = puVar3[uVar8] - uVar1;
                  uVar2 = uVar2 + 1;
                }
                puVar3 = tree->lengths;
                uVar4 = puVar3[uVar6];
              } while (uVar2 != uVar4);
              uVar2 = tree->numcodes;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar2);
          if ((uVar2 & 0x7fffffff) != 0) {
            uVar6 = 0;
            do {
              if (tree->tree2d[uVar6] == 0x7fff) {
                tree->tree2d[uVar6] = 0;
                uVar2 = tree->numcodes;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < uVar2 * 2);
            return 0;
          }
        }
        return 0;
      }
    }
  }
  free(local_48.data);
  free(local_68.data);
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
	uivector blcount;
	uivector nextcode;
	unsigned error = 0;
	unsigned bits, n;

	uivector_init(&blcount);
	uivector_init(&nextcode);

	tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
	if (!tree->tree1d) error = 83; /*alloc fail*/

	if (!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
		|| !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
		error = 83; /*alloc fail*/

	if (!error)
	{
		/*step 1: count number of instances of each code length*/
		for (bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
		/*step 2: generate the nextcode values*/
		for (bits = 1; bits <= tree->maxbitlen; ++bits)
		{
			nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
		}
		/*step 3: generate all the codes*/
		for (n = 0; n != tree->numcodes; ++n)
		{
			if (tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
		}
	}

	uivector_cleanup(&blcount);
	uivector_cleanup(&nextcode);

	if (!error) return HuffmanTree_make2DTree(tree);
	else return error;
}